

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::ReduceClassic
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *polyRight)

{
  _List_node_base **m2;
  _List_node_base **polyRight_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *this_00;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  MP<136UL,_GF2::MOGrevlex<136UL>_> local_68;
  MM<136UL> local_48;
  
  local_68.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size = 0;
  bVar2 = false;
  p_Var4 = (_List_node_base *)polyRight;
  local_68.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_68.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
       super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
LAB_0012f87f:
  do {
    p_Var4 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var4->_M_next)->
             super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    do {
      if (p_Var4 == (_List_node_base *)polyRight) {
        std::__cxx11::_List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::_M_clear
                  ((_List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&local_68);
        return bVar2;
      }
      m2 = &p_Var4[1]._M_next;
      p_Var5 = (_List_node_base *)this;
      do {
        p_Var5 = (((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                    *)&p_Var5->_M_next)->
                 super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var5 == (_List_node_base *)this) goto LAB_0012f87f;
        iVar3 = MOGrevlex<136UL>::Compare
                          ((MOGrevlex<136UL> *)&this->field_0x18,
                           (MM<136UL> *)(*(long *)(p_Var5 + 1) + 0x10),(MM<136UL> *)m2);
        polyRight_00 = &p_Var5[1]._M_next;
        if (0 < iVar3) goto LAB_0012f87f;
        bVar1 = MM<136UL>::IsDivide((MM<136UL> *)((long)*polyRight_00 + 0x10),(MM<136UL> *)m2);
      } while (!bVar1);
      operator/(&local_48,(MM<136UL> *)m2,(MM<136UL> *)((long)*polyRight_00 + 0x10));
      this_00 = MP<136UL,_GF2::MOGrevlex<136UL>_>::operator=
                          (&local_68,(MP<136UL,_GF2::MOGrevlex<136UL>_> *)polyRight_00);
      MP<136UL,_GF2::MOGrevlex<136UL>_>::operator*=(this_00,&local_48);
      MP<136UL,_GF2::MOGrevlex<136UL>_>::SymDiffSplice(polyRight,&local_68);
      p_Var4 = (polyRight->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
               super__List_node_base._M_next;
      bVar2 = true;
    } while (p_Var5 != (_List_node_base *)this);
  } while( true );
}

Assistant:

bool ReduceClassic(MP<_n, _O>& polyRight) const
	{	
		assert(IsConsistent(polyRight));
		bool changed = false;
		MP<_n, _O> poly(_order);
		// двигаемся от старших мономов polyRight к младшим
		auto iterMon = polyRight.begin();
		while (iterMon != polyRight.end())
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), *iterMon) > 0)
				{
					iterPoly = end();
					break;
				}
				// делим при возможности
				else if (iterPoly->LM() | *iterMon)
				{
					changed = true;
					(poly = *iterPoly) *= *iterMon / iterPoly->LM();
					polyRight.SymDiffSplice(poly);
					iterMon = polyRight.begin();
					break;
				}
			}
			if (iterPoly == end())
				++iterMon;
		}
		return changed;
	}